

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O2

Mat Eye(int n)

{
  long lVar1;
  int j;
  ulong uVar2;
  double *pdVar3;
  uint in_ESI;
  undefined4 in_register_0000003c;
  double *pdVar4;
  Mat MVar5;
  
  Mat::Mat((Mat *)CONCAT44(in_register_0000003c,n),in_ESI,in_ESI);
  lVar1 = *(long *)(CONCAT44(in_register_0000003c,n) + 8);
  for (uVar2 = 0; in_ESI * in_ESI != uVar2; uVar2 = uVar2 + 1) {
    *(undefined8 *)(lVar1 + uVar2 * 8) = 0;
  }
  pdVar3 = (double *)0x0;
  pdVar4 = (double *)(ulong)in_ESI;
  if ((int)in_ESI < 1) {
    pdVar4 = pdVar3;
  }
  while (pdVar4 != (double *)0x0) {
    *(undefined8 *)(lVar1 + (long)(int)pdVar3 * 8) = 0x3ff0000000000000;
    pdVar3 = (double *)(ulong)((int)pdVar3 + in_ESI + 1);
    pdVar4 = (double *)((long)pdVar4 - 1);
  }
  MVar5.v_ = pdVar3;
  MVar5.n_rows_ = n;
  MVar5.n_cols_ = in_register_0000003c;
  return MVar5;
}

Assistant:

Mat Eye(const int n)
{
	Mat eyeMat(n, n);
	for (int j=0; j<n*n; j++)
		eyeMat.v_[j] = 0.0;
	for (int i=0; i<n; i++)
		eyeMat.v_[i*n + i] = 1.0;
	return eyeMat;
}